

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,const_iterator first,const_iterator last)

{
  Rep *pRVar1;
  void **ppvVar2;
  void **ppvVar3;
  int start;
  
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar2 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar2 = (void **)0x0;
  }
  start = (int)((ulong)((long)first.it_ - (long)ppvVar2) >> 3);
  DeleteSubrange(this,start,(int)((ulong)((long)last.it_ - (long)ppvVar2) >> 3) - start);
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar3 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  return (iterator)
         (void **)((((long)first.it_ - (long)ppvVar2) * 0x20000000 >> 0x1d) + (long)ppvVar3);
}

Assistant:

inline typename RepeatedPtrField<Element>::iterator
RepeatedPtrField<Element>::erase(const_iterator first, const_iterator last) {
  size_type pos_offset = std::distance(cbegin(), first);
  size_type last_offset = std::distance(cbegin(), last);
  DeleteSubrange(pos_offset, last_offset - pos_offset);
  return begin() + pos_offset;
}